

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::interpolation
          (MLEBABecLap *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  bool bVar1;
  pointer pFVar2;
  int iVar3;
  long lVar4;
  long *in_RDI;
  int kc_1;
  int jc_1;
  int ic_1;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_amrex::EBCellFlag> *flg;
  int kc;
  int jc;
  int ic;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *ffab;
  Array4<const_double> *cfab;
  FabType fabtyp;
  Box *bx;
  MFIter mfi;
  int ncomp;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  int local_500;
  int local_4f0;
  undefined4 in_stack_fffffffffffffb14;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffb18;
  long *plVar5;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  int local_4d4;
  int local_4c4;
  int local_4b4;
  undefined4 in_stack_fffffffffffffb50;
  FabType in_stack_fffffffffffffb54;
  FabArray<amrex::EBCellFlagFab> *local_4a0;
  long local_498;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  long local_420 [6];
  Box *in_stack_fffffffffffffc10;
  EBCellFlagFab *in_stack_fffffffffffffc18;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  int local_358;
  int local_354;
  int local_350;
  long *local_338;
  long local_330 [8];
  long *local_2f0;
  FabType local_2e8;
  int local_2e4 [7];
  int *local_2c8;
  MFIter local_2c0;
  int local_25c;
  FabArray<amrex::EBCellFlagFab> *local_258;
  long local_250;
  undefined8 local_228;
  int local_220;
  int *local_218;
  int local_20c;
  int iStack_208;
  int local_204;
  undefined8 local_200;
  int local_1f8;
  int *local_1f0;
  int local_1e4;
  int iStack_1e0;
  int local_1dc;
  undefined8 local_1d8;
  int local_1d0;
  int *local_1c8;
  int local_1bc;
  int iStack_1b8;
  int local_1b4;
  undefined8 local_1b0;
  int local_1a8;
  int *local_1a0;
  int local_194;
  int iStack_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  long *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  long *local_160;
  int local_154;
  int local_150;
  int local_14c;
  long *local_148;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  long *local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  long *local_118;
  undefined4 local_110;
  int local_10c;
  int local_108;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined4 local_f8;
  int local_f4;
  int local_f0;
  undefined4 local_ec;
  int local_e8;
  int local_e4;
  undefined4 local_e0;
  int local_dc;
  int local_d8;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  uint *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffb14 >> 0x18);
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  pFVar2 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  if (pFVar2 == (pointer)0x0) {
    local_498 = 0;
  }
  else {
    local_498 = __dynamic_cast(pFVar2,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
  }
  local_250 = local_498;
  if (local_498 == 0) {
    local_4a0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_4a0 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)
                           CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  }
  local_258 = local_4a0;
  local_25c = (**(code **)(*in_RDI + 0x28))();
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 in_stack_fffffffffffffb18,(bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_2c0), bVar1) {
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    local_2c8 = local_2e4;
    if (local_258 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      in_stack_fffffffffffffb54 = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 (MFIter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      in_stack_fffffffffffffb54 =
           EBCellFlagFab::getType(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    }
    local_2e8 = in_stack_fffffffffffffb54;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               (MFIter *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    local_2f0 = local_330;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               (MFIter *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    local_338 = &local_378;
    if (local_2e8 == regular) {
      local_1f0 = local_2c8;
      local_38 = local_2c8;
      local_3c = 0;
      local_1e4 = *local_2c8;
      local_48 = local_2c8;
      local_4c = 1;
      iStack_1e0 = local_2c8[1];
      local_200 = *(undefined8 *)local_2c8;
      local_58 = local_2c8;
      local_5c = 2;
      local_1f8 = local_2c8[2];
      local_1a0 = local_2c8;
      local_98 = local_2c8 + 3;
      local_9c = 0;
      local_194 = *local_98;
      local_a8 = local_2c8 + 3;
      local_ac = 1;
      iStack_190 = local_2c8[4];
      local_1b0 = *(undefined8 *)local_98;
      local_b8 = local_2c8 + 3;
      local_bc = 2;
      local_1a8 = local_2c8[5];
      for (local_3bc = 0; local_3c0 = local_1f8, local_1dc = local_1f8, local_18c = local_1a8,
          local_3bc < local_25c; local_3bc = local_3bc + 1) {
        for (; local_3c4 = iStack_1e0, local_3c0 <= local_1a8; local_3c0 = local_3c0 + 1) {
          for (; local_3c8 = local_1e4, local_3c4 <= iStack_190; local_3c4 = local_3c4 + 1) {
            for (; local_3c8 <= local_194; local_3c8 = local_3c8 + 1) {
              local_d0 = local_3c8;
              local_d4 = 2;
              in_stack_fffffffffffffb50 = 2;
              if (local_3c8 < 0) {
                iVar3 = local_3c8 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_4b4 = -iVar3 / 2 + -1;
              }
              else {
                local_4b4 = local_3c8 / 2;
              }
              local_cc = local_4b4;
              local_dc = local_3c4;
              local_e0 = 2;
              if (local_3c4 < 0) {
                iVar3 = local_3c4 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_4c4 = -iVar3 / 2 + -1;
              }
              else {
                local_4c4 = local_3c4 / 2;
              }
              local_d8 = local_4c4;
              local_e8 = local_3c0;
              local_ec = 2;
              if (local_3c0 < 0) {
                iVar3 = local_3c0 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_4d4 = -iVar3 / 2 + -1;
              }
              else {
                local_4d4 = local_3c0 / 2;
              }
              local_e4 = local_4d4;
              local_118 = local_2f0;
              local_11c = local_4b4;
              local_120 = local_4c4;
              local_124 = local_4d4;
              local_128 = local_3bc;
              local_164 = local_3c8;
              local_168 = local_3c4;
              local_16c = local_3c0;
              local_170 = local_3bc;
              lVar4 = (long)(local_3c8 - local_358) + (local_3c4 - local_354) * local_370 +
                      (local_3c0 - local_350) * local_368 + local_3bc * local_360;
              *(double *)(local_378 + lVar4 * 8) =
                   *(double *)
                    (*local_2f0 +
                    ((long)(local_4b4 - (int)local_2f0[4]) +
                     (long)(local_4c4 - *(int *)((long)local_2f0 + 0x24)) * local_2f0[1] +
                     (long)(local_4d4 - (int)local_2f0[5]) * local_2f0[2] +
                    (long)local_3bc * local_2f0[3]) * 8) + *(double *)(local_378 + lVar4 * 8);
              local_160 = local_338;
            }
          }
        }
      }
    }
    else if (local_2e8 == singlevalued) {
      plVar5 = local_420;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 (MFIter *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      local_218 = local_2c8;
      local_8 = local_2c8;
      local_c = 0;
      local_20c = *local_2c8;
      local_18 = local_2c8;
      local_1c = 1;
      iStack_208 = local_2c8[1];
      local_228 = *(undefined8 *)local_2c8;
      local_28 = local_2c8;
      local_2c = 2;
      local_220 = local_2c8[2];
      local_1c8 = local_2c8;
      local_68 = local_2c8 + 3;
      local_6c = 0;
      local_1bc = *local_68;
      local_78 = local_2c8 + 3;
      local_7c = 1;
      iStack_1b8 = local_2c8[4];
      local_1d8 = *(undefined8 *)local_68;
      local_88 = local_2c8 + 3;
      local_8c = 2;
      local_1d0 = local_2c8[5];
      for (local_464 = 0; local_468 = local_220, local_204 = local_220, local_1b4 = local_1d0,
          local_464 < local_25c; local_464 = local_464 + 1) {
        for (; local_46c = iStack_208, local_468 <= local_1d0; local_468 = local_468 + 1) {
          for (; local_470 = local_20c, local_46c <= iStack_1b8; local_46c = local_46c + 1) {
            for (; local_470 <= local_1bc; local_470 = local_470 + 1) {
              local_14c = local_470;
              local_150 = local_46c;
              local_154 = local_468;
              local_c8 = (uint *)(*plVar5 +
                                 ((long)(local_470 - (int)plVar5[4]) +
                                  (long)(local_46c - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                                 (long)(local_468 - (int)plVar5[5]) * plVar5[2]) * 4);
              if ((*local_c8 & 3) != 3) {
                local_f4 = local_470;
                local_f8 = 2;
                if (local_470 < 0) {
                  iVar3 = local_470 + 1;
                  if (iVar3 < 1) {
                    iVar3 = -iVar3;
                  }
                  local_4f0 = -iVar3 / 2 + -1;
                }
                else {
                  local_4f0 = local_470 / 2;
                }
                local_f0 = local_4f0;
                local_100 = local_46c;
                local_104 = 2;
                if (local_46c < 0) {
                  iVar3 = local_46c + 1;
                  if (iVar3 < 1) {
                    iVar3 = -iVar3;
                  }
                  local_500 = -iVar3 / 2 + -1;
                }
                else {
                  local_500 = local_46c / 2;
                }
                local_fc = local_500;
                local_10c = local_468;
                local_110 = 2;
                in_stack_fffffffffffffaf4 = 2;
                if (local_468 < 0) {
                  iVar3 = local_468 + 1;
                  if (iVar3 < 1) {
                    iVar3 = -iVar3;
                  }
                  in_stack_fffffffffffffaf0 = -iVar3 / 2 + -1;
                }
                else {
                  in_stack_fffffffffffffaf0 = local_468 / 2;
                }
                local_130 = local_2f0;
                local_134 = local_4f0;
                local_138 = local_500;
                local_140 = local_464;
                local_178 = local_338;
                local_17c = local_470;
                local_180 = local_46c;
                local_184 = local_468;
                local_188 = local_464;
                lVar4 = (long)(local_470 - (int)local_338[4]) +
                        (long)(local_46c - *(int *)((long)local_338 + 0x24)) * local_338[1] +
                        (long)(local_468 - (int)local_338[5]) * local_338[2] +
                        (long)local_464 * local_338[3];
                *(double *)(*local_338 + lVar4 * 8) =
                     *(double *)
                      (*local_2f0 +
                      ((long)(local_4f0 - (int)local_2f0[4]) +
                       (long)(local_500 - *(int *)((long)local_2f0 + 0x24)) * local_2f0[1] +
                       (long)(in_stack_fffffffffffffaf0 - (int)local_2f0[5]) * local_2f0[2] +
                      (long)local_464 * local_2f0[3]) * 8) + *(double *)(*local_338 + lVar4 * 8);
                local_13c = in_stack_fffffffffffffaf0;
                local_108 = in_stack_fffffffffffffaf0;
              }
              local_148 = plVar5;
            }
          }
        }
      }
    }
    MFIter::operator++(&local_2c0);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  return;
}

Assistant:

void
MLEBABecLap::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
    BL_PROFILE("MLEBABecLap::interpolation()");

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][fmglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const int ncomp = getNComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        Array4<Real const> const& cfab = crse.const_array(mfi);
        Array4<Real> const& ffab = fine.array(mfi);

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,2);
                int jc = amrex::coarsen(j,2);
                int kc = amrex::coarsen(k,2);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<EBCellFlag const> const& flg = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (!flg(i,j,k).isCovered()) {
                    int ic = amrex::coarsen(i,2);
                    int jc = amrex::coarsen(j,2);
                    int kc = amrex::coarsen(k,2);
                    ffab(i,j,k,n) += cfab(ic,jc,kc,n);
                }
            });
        }
    }
}